

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::TexImageCubeArrayDepthBufferCase::TexImageCubeArrayDepthBufferCase
          (TexImageCubeArrayDepthBufferCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int imageSize,int numLayers)

{
  TextureFormatInfo *pTVar1;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(internalFormat);
  TextureCubeArraySpecCase::TextureCubeArraySpecCase
            (&this->super_TextureCubeArraySpecCase,context,name,desc,&local_38,imageSize,numLayers,1
            );
  (this->super_TextureCubeArraySpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.
  super_TestNode._vptr_TestNode = (_func_int **)&PTR__TextureCubeArraySpecCase_021a2f90;
  *(deUint32 *)&(this->super_TextureCubeArraySpecCase).field_0xd4 = internalFormat;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupBias.m_data[0] = 0.25;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupBias.m_data[1] = 0.0;
  pTVar1 = &(this->super_TextureCubeArraySpecCase).m_texFormatInfo;
  (pTVar1->lookupBias).m_data[2] = 0.0;
  (pTVar1->lookupBias).m_data[3] = 1.0;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupScale.m_data[0] = 0.5;
  (this->super_TextureCubeArraySpecCase).m_texFormatInfo.lookupScale.m_data[1] = 1.0;
  pTVar1 = &(this->super_TextureCubeArraySpecCase).m_texFormatInfo;
  (pTVar1->lookupScale).m_data[2] = 1.0;
  (pTVar1->lookupScale).m_data[3] = 0.0;
  return;
}

Assistant:

TexImageCubeArrayDepthBufferCase (Context&	context,
									const char*	name,
									const char*	desc,
									deUint32	internalFormat,
									int			imageSize,
									int			numLayers)
		: TextureCubeArraySpecCase(context, name, desc, glu::mapGLInternalFormat(internalFormat), imageSize, numLayers, 1)
		, m_internalFormat		(internalFormat)
	{
		// we are interested in the behavior near [-2, 2], map it to visible range [0, 1]
		m_texFormatInfo.lookupBias = Vec4(0.25f, 0.0f, 0.0f, 1.0f);
		m_texFormatInfo.lookupScale = Vec4(0.5f, 1.0f, 1.0f, 0.0f);
	}